

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O3

void __thiscall
slang::ast::AssignmentExpression::visitExprs<netlist::VariableReferenceVisitor&>
          (AssignmentExpression *this,VariableReferenceVisitor *visitor)

{
  if (this->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<netlist::VariableReferenceVisitor>(this->timingControl,visitor);
  }
  Expression::visitExpression<slang::ast::Expression_const,netlist::VariableReferenceVisitor&>
            (this->left_,this->left_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,netlist::VariableReferenceVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }